

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void llvm::interpretDecimal(iterator begin,iterator end,decimalInfo *D)

{
  uint uVar1;
  int iVar2;
  decimalInfo *pdVar3;
  bool bVar4;
  bool local_37;
  decimalInfo *local_30;
  iterator p;
  iterator dot;
  decimalInfo *D_local;
  iterator end_local;
  iterator begin_local;
  
  p = end;
  dot = (iterator)D;
  D_local = (decimalInfo *)end;
  end_local = begin;
  local_30 = (decimalInfo *)skipLeadingZeroesAndAnyDot(begin,end,&p);
  *(decimalInfo **)dot = local_30;
  dot[0x10] = '\0';
  dot[0x11] = '\0';
  dot[0x12] = '\0';
  dot[0x13] = '\0';
  dot[0x14] = '\0';
  dot[0x15] = '\0';
  dot[0x16] = '\0';
  dot[0x17] = '\0';
  for (; local_30 != D_local; local_30 = (decimalInfo *)((long)&local_30->firstSigDigit + 1)) {
    if (*(char *)&local_30->firstSigDigit == '.') {
      if ((decimalInfo *)p != D_local) {
        __assert_fail("dot == end && \"String contains multiple dots\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x155,
                      "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                     );
      }
      pdVar3 = (decimalInfo *)((long)&local_30->firstSigDigit + 1);
      p = (iterator)local_30;
      local_30 = pdVar3;
      if (pdVar3 == D_local) break;
    }
    uVar1 = decDigitValue((int)*(char *)&local_30->firstSigDigit);
    if (9 < uVar1) break;
  }
  if (local_30 != D_local) {
    if ((*(char *)&local_30->firstSigDigit == 'e') ||
       (bVar4 = false, *(char *)&local_30->firstSigDigit == 'E')) {
      bVar4 = true;
    }
    if (!bVar4) {
      __assert_fail("(*p == \'e\' || *p == \'E\') && \"Invalid character in significand\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x15f,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    if (local_30 == (decimalInfo *)end_local) {
      __assert_fail("p != begin && \"Significand has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x160,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    if (((decimalInfo *)p == D_local) || (bVar4 = false, (long)local_30 - (long)end_local != 1)) {
      bVar4 = true;
    }
    if (!bVar4) {
      __assert_fail("(dot == end || p - begin != 1) && \"Significand has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x161,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    iVar2 = readExponent((iterator)((long)&local_30->firstSigDigit + 1),(iterator)D_local);
    *(int *)(dot + 0x10) = iVar2;
    if ((decimalInfo *)p == D_local) {
      p = (iterator)local_30;
    }
  }
  if (local_30 != *(decimalInfo **)dot) {
    if (local_30 != (decimalInfo *)end_local) {
      do {
        do {
          local_30 = (decimalInfo *)((long)&local_30[-1].normalizedExponent + 3);
          bVar4 = false;
          if (local_30 != (decimalInfo *)end_local) {
            bVar4 = *(char *)&local_30->firstSigDigit == '0';
          }
        } while (bVar4);
        bVar4 = false;
        if (local_30 != (decimalInfo *)end_local) {
          bVar4 = *(char *)&local_30->firstSigDigit == '.';
        }
      } while (bVar4);
    }
    *(int *)(dot + 0x10) =
         (int)(short)(((short)p - (short)local_30) - (ushort)(local_30 < p)) + *(int *)(dot + 0x10);
    local_37 = *(iterator *)dot < p && p < local_30;
    *(int *)(dot + 0x14) =
         *(int *)(dot + 0x10) +
         (int)(short)(((short)local_30 - (short)*(undefined8 *)dot) - (ushort)local_37);
  }
  *(decimalInfo **)(dot + 8) = local_30;
  return;
}

Assistant:

static void
interpretDecimal(StringRef::iterator begin, StringRef::iterator end,
                 decimalInfo *D)
{
  StringRef::iterator dot = end;
  StringRef::iterator p = skipLeadingZeroesAndAnyDot (begin, end, &dot);

  D->firstSigDigit = p;
  D->exponent = 0;
  D->normalizedExponent = 0;

  for (; p != end; ++p) {
    if (*p == '.') {
      assert(dot == end && "String contains multiple dots");
      dot = p++;
      if (p == end)
        break;
    }
    if (decDigitValue(*p) >= 10U)
      break;
  }

  if (p != end) {
    assert((*p == 'e' || *p == 'E') && "Invalid character in significand");
    assert(p != begin && "Significand has no digits");
    assert((dot == end || p - begin != 1) && "Significand has no digits");

    /* p points to the first non-digit in the string */
    D->exponent = readExponent(p + 1, end);

    /* Implied decimal point?  */
    if (dot == end)
      dot = p;
  }

  /* If number is all zeroes accept any exponent.  */
  if (p != D->firstSigDigit) {
    /* Drop insignificant trailing zeroes.  */
    if (p != begin) {
      do
        do
          p--;
        while (p != begin && *p == '0');
      while (p != begin && *p == '.');
    }

    /* Adjust the exponents for any decimal point.  */
    D->exponent += static_cast<APFloat::ExponentType>((dot - p) - (dot > p));
    D->normalizedExponent = (D->exponent +
              static_cast<APFloat::ExponentType>((p - D->firstSigDigit)
                                      - (dot > D->firstSigDigit && dot < p)));
  }

  D->lastSigDigit = p;
}